

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O3

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<Qt::DayOfWeek>>
          (QtPrivate *this,QDebug debug,char *which,QList<Qt::DayOfWeek> *c)

{
  char *pcVar1;
  DayOfWeek *pDVar2;
  long lVar3;
  QString *pQVar4;
  undefined1 *puVar5;
  DayOfWeek *pDVar6;
  QString *this_00;
  Stream *this_01;
  QTextStream *pQVar7;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QDebugStateSaver saver;
  QDebug local_78;
  QDebug local_70;
  QDebug local_68;
  QDebug local_60;
  QDebugStateSaver local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  puVar5 = (undefined1 *)c;
  QDebugStateSaver::QDebugStateSaver(&local_58,(QDebug *)debug.stream);
  pQVar7 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  *(undefined1 *)&pQVar7[3]._vptr_QTextStream = 0;
  if (which == (char *)0x0) {
    this_00 = (QString *)0x0;
  }
  else {
    pQVar4 = (QString *)0xffffffffffffffff;
    do {
      this_00 = (QString *)((long)&(pQVar4->d).d + 1);
      pcVar1 = which + 1 + (long)pQVar4;
      pQVar4 = this_00;
    } while (*pcVar1 != '\0');
  }
  ba.m_data = puVar5;
  ba.m_size = (qsizetype)which;
  QString::fromUtf8(&local_50,this_00,ba);
  ::QTextStream::operator<<(pQVar7,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar7 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar7[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar7,' ');
    pQVar7 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  }
  ::QTextStream::operator<<(pQVar7,'(');
  pQVar7 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar7[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar7,' ');
  }
  pDVar2 = (c->d).ptr;
  lVar3 = (c->d).size;
  pDVar6 = pDVar2;
  if (lVar3 != 0) {
    local_68.stream = (Stream *)((debug.stream)->ts)._vptr_QTextStream;
    (local_68.stream)->ref = (local_68.stream)->ref + 1;
    puVar5 = Qt::staticMetaObject;
    qt_QMetaEnum_debugOperator
              (&local_60,(qint64)&local_68,(QMetaObject *)(ulong)*pDVar2,Qt::staticMetaObject);
    QDebug::~QDebug(&local_60);
    QDebug::~QDebug(&local_68);
    pDVar6 = pDVar2 + 1;
  }
  if (pDVar6 != pDVar2 + lVar3) {
    do {
      pQVar7 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
      ba_00.m_data = puVar5;
      ba_00.m_size = (qsizetype)", ";
      QString::fromUtf8(&local_50,(QString *)0x2,ba_00);
      ::QTextStream::operator<<(pQVar7,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      this_01 = (Stream *)((debug.stream)->ts)._vptr_QTextStream;
      if (this_01->space == true) {
        ::QTextStream::operator<<((QTextStream *)this_01,' ');
        this_01 = (Stream *)((debug.stream)->ts)._vptr_QTextStream;
      }
      this_01->ref = this_01->ref + 1;
      puVar5 = Qt::staticMetaObject;
      local_78.stream = this_01;
      qt_QMetaEnum_debugOperator
                (&local_70,(qint64)&local_78,(QMetaObject *)(ulong)*pDVar6,Qt::staticMetaObject);
      QDebug::~QDebug(&local_70);
      QDebug::~QDebug(&local_78);
      pDVar6 = pDVar6 + 1;
    } while (pDVar6 != pDVar2 + lVar3);
  }
  ::QTextStream::operator<<((QTextStream *)((debug.stream)->ts)._vptr_QTextStream,')');
  pQVar7 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar7[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar7,' ');
    pQVar7 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  }
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)0x0;
  *(QTextStream **)this = pQVar7;
  QDebugStateSaver::~QDebugStateSaver(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}